

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCountedObjectImpl.hpp
# Opt level: O3

ResourceMappingImpl * __thiscall
Diligent::MakeNewRCObj<Diligent::ResourceMappingImpl,Diligent::FixedBlockMemoryAllocator>::
operator()(MakeNewRCObj<Diligent::ResourceMappingImpl,Diligent::FixedBlockMemoryAllocator> *this,
          IMemoryAllocator *CtorArgs)

{
  RefCountersImpl *pRefCounters;
  RefCountersImpl *this_00;
  ResourceMappingImpl *pObject;
  
  if (*(long **)(this + 8) == (long *)0x0) {
    this_00 = (RefCountersImpl *)operator_new(0x30);
    (this_00->super_IReferenceCounters)._vptr_IReferenceCounters =
         (_func_int **)&PTR_AddStrongRef_00424b98;
    (this_00->m_ObjectState)._M_i = NotInitialized;
    this_00->m_ObjectWrapperBuffer[0] = 0;
    this_00->m_ObjectWrapperBuffer[1] = 0;
    this_00->m_ObjectWrapperBuffer[2] = 0;
    this_00->m_NumStrongReferences = (__atomic_base<int>)0x0;
    this_00->m_NumWeakReferences = (__atomic_base<int>)0x0;
    (this_00->m_Lock).m_IsLocked._M_base._M_i = false;
    pRefCounters = this_00;
  }
  else {
    pRefCounters = (RefCountersImpl *)(**(code **)(**(long **)(this + 8) + 0x18))();
    this_00 = (RefCountersImpl *)0x0;
  }
  if (*(FixedBlockMemoryAllocator **)this == (FixedBlockMemoryAllocator *)0x0) {
    pObject = (ResourceMappingImpl *)malloc(0x70);
  }
  else {
    pObject = (ResourceMappingImpl *)
              FixedBlockMemoryAllocator::Allocate
                        (*(FixedBlockMemoryAllocator **)this,0x70,*(Char **)(this + 0x10),
                         *(char **)(this + 0x18),*(Int32 *)(this + 0x20));
  }
  RefCountedObject<Diligent::IResourceMapping>::RefCountedObject<>
            ((RefCountedObject<Diligent::IResourceMapping> *)pObject,
             &pRefCounters->super_IReferenceCounters);
  (pObject->super_ObjectBase<Diligent::IResourceMapping>).
  super_RefCountedObject<Diligent::IResourceMapping>.super_IResourceMapping.super_IObject.
  _vptr_IObject = (_func_int **)&PTR_QueryInterface_00429690;
  (pObject->m_Lock).m_IsLocked._M_base._M_i = false;
  (pObject->m_HashTable)._M_h.
  super__Hashtable_alloc<Diligent::STDAllocator<std::__detail::_Hash_node<std::pair<const_Diligent::ResourceMappingImpl::ResMappingHashKey,_Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>,_false>,_Diligent::IMemoryAllocator>_>
  .
  super__Hashtable_ebo_helper<0,_Diligent::STDAllocator<std::__detail::_Hash_node<std::pair<const_Diligent::ResourceMappingImpl::ResMappingHashKey,_Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>,_false>,_Diligent::IMemoryAllocator>,_false>
  ._M_tp.m_Allocator = CtorArgs;
  (pObject->m_HashTable)._M_h.
  super__Hashtable_alloc<Diligent::STDAllocator<std::__detail::_Hash_node<std::pair<const_Diligent::ResourceMappingImpl::ResMappingHashKey,_Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>,_false>,_Diligent::IMemoryAllocator>_>
  .
  super__Hashtable_ebo_helper<0,_Diligent::STDAllocator<std::__detail::_Hash_node<std::pair<const_Diligent::ResourceMappingImpl::ResMappingHashKey,_Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>,_false>,_Diligent::IMemoryAllocator>,_false>
  ._M_tp.m_dvpDescription =
       "Allocator for unordered_map<ResMappingHashKey, RefCntAutoPtr<IDeviceObject>>";
  (pObject->m_HashTable)._M_h.
  super__Hashtable_alloc<Diligent::STDAllocator<std::__detail::_Hash_node<std::pair<const_Diligent::ResourceMappingImpl::ResMappingHashKey,_Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>,_false>,_Diligent::IMemoryAllocator>_>
  .
  super__Hashtable_ebo_helper<0,_Diligent::STDAllocator<std::__detail::_Hash_node<std::pair<const_Diligent::ResourceMappingImpl::ResMappingHashKey,_Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>,_false>,_Diligent::IMemoryAllocator>,_false>
  ._M_tp.m_dvpFileName =
       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ResourceMappingImpl.hpp"
  ;
  (pObject->m_HashTable)._M_h.
  super__Hashtable_alloc<Diligent::STDAllocator<std::__detail::_Hash_node<std::pair<const_Diligent::ResourceMappingImpl::ResMappingHashKey,_Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>,_false>,_Diligent::IMemoryAllocator>_>
  .
  super__Hashtable_ebo_helper<0,_Diligent::STDAllocator<std::__detail::_Hash_node<std::pair<const_Diligent::ResourceMappingImpl::ResMappingHashKey,_Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>,_false>,_Diligent::IMemoryAllocator>,_false>
  ._M_tp.m_dvpLineNumber = 0x38;
  (pObject->m_HashTable)._M_h._M_buckets = &(pObject->m_HashTable)._M_h._M_single_bucket;
  (pObject->m_HashTable)._M_h._M_bucket_count = 1;
  (pObject->m_HashTable)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (pObject->m_HashTable)._M_h._M_element_count = 0;
  (pObject->m_HashTable)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (pObject->m_HashTable)._M_h._M_rehash_policy._M_next_resize = 0;
  (pObject->m_HashTable)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  if (this_00 != (RefCountersImpl *)0x0) {
    RefCountersImpl::Attach<Diligent::ResourceMappingImpl,Diligent::FixedBlockMemoryAllocator>
              (this_00,pObject,*(FixedBlockMemoryAllocator **)this);
  }
  return pObject;
}

Assistant:

ObjectType* operator()(CtorArgTypes&&... CtorArgs)
    {
        RefCountersImpl*    pNewRefCounters = nullptr;
        IReferenceCounters* pRefCounters    = nullptr;
        if (m_pOwner != nullptr)
            pRefCounters = m_pOwner->GetReferenceCounters();
        else
        {
            // Constructor of RefCountersImpl class is private and only accessible
            // by methods of MakeNewRCObj
            pNewRefCounters = new RefCountersImpl{};
            pRefCounters    = pNewRefCounters;
        }
        ObjectType* pObj = nullptr;
        try
        {
#ifndef DILIGENT_DEVELOPMENT
            static constexpr const char* m_dvpDescription = "<Unavailable in release build>";
            static constexpr const char* m_dvpFileName    = "<Unavailable in release build>";
            static constexpr Int32       m_dvpLineNumber  = -1;
#endif
            // Operators new and delete of RefCountedObject are private and only accessible
            // by methods of MakeNewRCObj
            if (m_pAllocator)
                pObj = new (*m_pAllocator, m_dvpDescription, m_dvpFileName, m_dvpLineNumber) ObjectType{pRefCounters, std::forward<CtorArgTypes>(CtorArgs)...};
            else
                pObj = new ObjectType{pRefCounters, std::forward<CtorArgTypes>(CtorArgs)...};
            if (pNewRefCounters != nullptr)
                pNewRefCounters->Attach<ObjectType, AllocatorType>(pObj, m_pAllocator);
        }
        catch (...)
        {
            if (pNewRefCounters != nullptr)
                pNewRefCounters->SelfDestroy();
            throw;
        }
        return pObj;
    }